

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyChannels<float>
               (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *channels,
               float delta)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  
  p_Var2 = (_List_node_base *)channels;
  while (p_Var2 = (((_List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)channels) {
    lVar3 = (long)p_Var2[1]._M_next;
    if ((long)p_Var2[1]._M_next < 1) {
      lVar3 = 0;
    }
    lVar4 = 0;
    for (lVar5 = 0; lVar5 != lVar3; lVar5 = lVar5 + 1) {
      p_Var1 = p_Var2[1]._M_prev;
      p_Var7 = (_List_node_base *)0x0;
      if (0 < (long)p_Var1) {
        p_Var7 = p_Var1;
      }
      lVar6 = (long)p_Var1 * lVar4;
      while (bVar8 = p_Var7 != (_List_node_base *)0x0,
            p_Var7 = (_List_node_base *)((long)&p_Var7[-1]._M_prev + 7), bVar8) {
        *(float *)((long)p_Var2[2]._M_next + lVar6) =
             *(float *)((long)p_Var2[2]._M_next + lVar6) + delta;
        lVar6 = lVar6 + 4;
      }
      lVar4 = lVar4 + 4;
    }
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}